

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_loop_filter_frame_mt
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,int plane_start,
               int plane_end,int partial_frame,AVxWorker *workers,int num_workers,AV1LfSync *lf_sync
               ,int lpf_opt_level)

{
  int iVar1;
  undefined4 in_ECX;
  YV12_BUFFER_CONFIG *in_RDX;
  undefined8 unaff_RBX;
  long in_RSI;
  AVxWorker *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  AV1_COMMON *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int planes_to_lf [3];
  int mi_rows_to_filter;
  int end_mi_row;
  int start_mi_row;
  int *in_stack_00000200;
  int in_stack_00000208;
  int in_stack_0000020c;
  MACROBLOCKD *in_stack_00000210;
  AV1_COMMON *in_stack_00000218;
  YV12_BUFFER_CONFIG *in_stack_00000220;
  int in_stack_00000260;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  loopfilter *in_stack_ffffffffffffffa8;
  int local_48;
  int *in_stack_ffffffffffffffc0;
  uint uVar2;
  
  iVar1 = check_planes_to_loop_filter
                    (in_stack_ffffffffffffffa8,
                     (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98)
  ;
  if (iVar1 != 0) {
    uVar2 = 0;
    local_48 = *(int *)(in_RSI + 0x214);
    if ((in_R9D != 0) && (8 < *(int *)(in_RSI + 0x214))) {
      uVar2 = *(int *)(in_RSI + 0x214) >> 1 & 0xfffffff8;
      if (*(int *)(in_RSI + 0x214) / 8 < 9) {
        local_48 = 8;
      }
      else {
        local_48 = *(int *)(in_RSI + 0x214) / 8;
      }
    }
    iVar1 = uVar2 + local_48;
    av1_loop_filter_frame_init(unaff_retaddr,(int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX);
    if (in_stack_00000010 < 2) {
      loop_filter_rows(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_0000020c,
                       in_stack_00000208,in_stack_00000200,in_stack_00000260);
    }
    else {
      loop_filter_rows_mt(in_RDX,(AV1_COMMON *)CONCAT44(in_ECX,in_R8D),
                          (MACROBLOCKD *)CONCAT44(in_R9D,uVar2),iVar1,local_48,
                          in_stack_ffffffffffffffc0,in_RDI,(int)unaff_RBX,(AV1LfSync *)unaff_retaddr
                          ,in_stack_00000008);
    }
  }
  return;
}

Assistant:

void av1_loop_filter_frame_mt(YV12_BUFFER_CONFIG *frame, AV1_COMMON *cm,
                              MACROBLOCKD *xd, int plane_start, int plane_end,
                              int partial_frame, AVxWorker *workers,
                              int num_workers, AV1LfSync *lf_sync,
                              int lpf_opt_level) {
  int start_mi_row, end_mi_row, mi_rows_to_filter;
  int planes_to_lf[MAX_MB_PLANE];

  if (!check_planes_to_loop_filter(&cm->lf, planes_to_lf, plane_start,
                                   plane_end))
    return;

  start_mi_row = 0;
  mi_rows_to_filter = cm->mi_params.mi_rows;
  if (partial_frame && cm->mi_params.mi_rows > 8) {
    start_mi_row = cm->mi_params.mi_rows >> 1;
    start_mi_row &= 0xfffffff8;
    mi_rows_to_filter = AOMMAX(cm->mi_params.mi_rows / 8, 8);
  }
  end_mi_row = start_mi_row + mi_rows_to_filter;
  av1_loop_filter_frame_init(cm, plane_start, plane_end);

  if (num_workers > 1) {
    // Enqueue and execute loopfiltering jobs.
    loop_filter_rows_mt(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                        workers, num_workers, lf_sync, lpf_opt_level);
  } else {
    // Directly filter in the main thread.
    loop_filter_rows(frame, cm, xd, start_mi_row, end_mi_row, planes_to_lf,
                     lpf_opt_level);
  }
}